

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O2

ErrorCode __thiscall ComponentManager::RemoveService(ComponentManager *this,CID cid)

{
  Node *pNVar1;
  ClassInfo *other;
  bool bVar2;
  Node *pNVar3;
  ClassInfo *info;
  iterator local_40;
  ClassInfo match;
  
  match.mClass = (ISupports *)0x0;
  pNVar3 = (this->mClasses).mHead;
  pNVar1 = (this->mClasses).mTail;
  match.mCid.mId = cid.mId;
  do {
    pNVar3 = pNVar3->next;
    if (pNVar3 == pNVar1) {
      return kNoClass;
    }
    other = pNVar3->val;
    bVar2 = JHCOM::ComId::operator==(&match.mCid,&other->mCid);
  } while (!bVar2);
  (*other->mClass->_vptr_ISupports[1])();
  operator_delete(other,0x10);
  JetHead::list<ComponentManager::ClassInfo_*>::iterator::erase(&local_40);
  return kNoError;
}

Assistant:

ErrorCode ComponentManager::RemoveService( CID cid )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	ClassInfo match( cid );

	for (JetHead::list<ClassInfo*>::iterator i = mClasses.begin(); 
		 i != mClasses.end(); ++i)
	{
		if (*(*i) == match)
		{
			ClassInfo *info = *i;
			info->mClass->Release();
			delete info;
			i.erase();
			return kNoError;
		}
	}
	
	return kNoClass;	
}